

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int is_whole_packet_present(stb_vorbis *f)

{
  bool bVar1;
  uint8 *puVar2;
  int iVar3;
  uint uVar4;
  vorb *in_RDI;
  int n;
  uint8 *q;
  uint8 *p;
  int first;
  int s;
  uint8 *local_20;
  uint local_14;
  
  local_14 = in_RDI->next_seg;
  bVar1 = true;
  local_20 = in_RDI->stream;
  if (local_14 != 0xffffffff) {
    for (; ((int)local_14 < in_RDI->segment_count &&
           (local_20 = local_20 + (int)(uint)in_RDI->segments[(int)local_14],
           in_RDI->segments[(int)local_14] == 0xff)); local_14 = local_14 + 1) {
    }
    if (local_14 == in_RDI->segment_count) {
      local_14 = 0xffffffff;
    }
    if (in_RDI->stream_end < local_20) {
      iVar3 = error(in_RDI,VORBIS_need_more_data);
      return iVar3;
    }
    bVar1 = false;
  }
  while( true ) {
    puVar2 = local_20;
    if (local_14 != 0xffffffff) {
      return 1;
    }
    if (in_RDI->stream_end <= *(uint8 (*) [4])(local_20 + 0x18) + 2) {
      iVar3 = error(in_RDI,VORBIS_need_more_data);
      return iVar3;
    }
    if (*(uint8 (*) [4])local_20 != ogg_page_header) {
      iVar3 = error(in_RDI,VORBIS_invalid_stream);
      return iVar3;
    }
    if ((*(uint8 (*) [4])(local_20 + 4))[0] != '\0') break;
    if (bVar1) {
      if ((in_RDI->previous_length != 0) && (((*(uint8 (*) [4])(local_20 + 4))[1] & 1) != 0)) {
        iVar3 = error(in_RDI,VORBIS_invalid_stream);
        return iVar3;
      }
    }
    else if (((*(uint8 (*) [4])(local_20 + 4))[1] & 1) == 0) {
      iVar3 = error(in_RDI,VORBIS_invalid_stream);
      return iVar3;
    }
    uVar4 = (uint)(*(uint8 (*) [4])(local_20 + 0x18))[2];
    local_20 = *(uint8 (*) [4])(local_20 + 0x18) + (long)(int)uVar4 + 3;
    if (in_RDI->stream_end < local_20) {
      iVar3 = error(in_RDI,VORBIS_need_more_data);
      return iVar3;
    }
    local_14 = 0;
    while (((int)local_14 < (int)uVar4 &&
           (local_20 = local_20 + (int)(uint)puVar2[(long)(int)local_14 + 0x1b],
           puVar2[(long)(int)local_14 + 0x1b] == 0xff))) {
      local_14 = local_14 + 1;
    }
    if (local_14 == uVar4) {
      local_14 = 0xffffffff;
    }
    if (in_RDI->stream_end < local_20) {
      iVar3 = error(in_RDI,VORBIS_need_more_data);
      return iVar3;
    }
    bVar1 = false;
  }
  iVar3 = error(in_RDI,VORBIS_invalid_stream);
  return iVar3;
}

Assistant:

static int is_whole_packet_present(stb_vorbis *f)
{
   // make sure that we have the packet available before continuing...
   // this requires a full ogg parse, but we know we can fetch from f->stream

   // instead of coding this out explicitly, we could save the current read state,
   // read the next packet with get8() until end-of-packet, check f->eof, then
   // reset the state? but that would be slower, esp. since we'd have over 256 bytes
   // of state to restore (primarily the page segment table)

   int s = f->next_seg, first = TRUE;
   uint8 *p = f->stream;

   if (s != -1) { // if we're not starting the packet with a 'continue on next page' flag
      for (; s < f->segment_count; ++s) {
         p += f->segments[s];
         if (f->segments[s] < 255)               // stop at first short segment
            break;
      }
      // either this continues, or it ends it...
      if (s == f->segment_count)
         s = -1; // set 'crosses page' flag
      if (p > f->stream_end)                     return error(f, VORBIS_need_more_data);
      first = FALSE;
   }
   for (; s == -1;) {
      uint8 *q;
      int n;

      // check that we have the page header ready
      if (p + 26 >= f->stream_end)               return error(f, VORBIS_need_more_data);
      // validate the page
      if (memcmp(p, ogg_page_header, 4))         return error(f, VORBIS_invalid_stream);
      if (p[4] != 0)                             return error(f, VORBIS_invalid_stream);
      if (first) { // the first segment must NOT have 'continued_packet', later ones MUST
         if (f->previous_length)
            if ((p[5] & PAGEFLAG_continued_packet))  return error(f, VORBIS_invalid_stream);
         // if no previous length, we're resynching, so we can come in on a continued-packet,
         // which we'll just drop
      } else {
         if (!(p[5] & PAGEFLAG_continued_packet)) return error(f, VORBIS_invalid_stream);
      }
      n = p[26]; // segment counts
      q = p+27;  // q points to segment table
      p = q + n; // advance past header
      // make sure we've read the segment table
      if (p > f->stream_end)                     return error(f, VORBIS_need_more_data);
      for (s=0; s < n; ++s) {
         p += q[s];
         if (q[s] < 255)
            break;
      }
      if (s == n)
         s = -1; // set 'crosses page' flag
      if (p > f->stream_end)                     return error(f, VORBIS_need_more_data);
      first = FALSE;
   }
   return TRUE;
}